

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O1

void __thiscall TPZReducedSpace::InitMaterialData(TPZReducedSpace *this,TPZMaterialData *data)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long *plVar5;
  long lVar6;
  TPZGeoEl *pTVar7;
  
  (data->super_TPZShapeData).fShapeType = EVecShape;
  uVar4 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xb8))();
  plVar5 = (long *)__dynamic_cast(uVar4,&TPZMaterial::typeinfo,&TPZMatSingleSpace::typeinfo,
                                  0xfffffffffffffffe);
  (**(code **)(*plVar5 + 0x48))(plVar5,data);
  lVar6 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa8))
                    (this,0);
  iVar2 = *(int *)(lVar6 + 0x18);
  bVar1 = *(byte *)(lVar6 + 0x15);
  pTVar7 = TPZCompEl::Reference((TPZCompEl *)this);
  iVar3 = (**(code **)(*(long *)pTVar7 + 0x210))(pTVar7);
  TPZFMatrix<double>::Resize(&(data->phi).super_TPZFMatrix<double>,(long)iVar2,(ulong)bVar1);
  lVar6 = (long)iVar3;
  TPZFMatrix<double>::Resize
            (&(data->dphix).super_TPZFMatrix<double>,(ulong)bVar1 * lVar6,(long)iVar2);
  TPZFMatrix<double>::Resize(&(data->jacobian).super_TPZFMatrix<double>,lVar6,lVar6);
  TPZFMatrix<double>::Resize(&(data->jacinv).super_TPZFMatrix<double>,lVar6,lVar6);
  TPZFMatrix<double>::Resize(&(data->axes).super_TPZFMatrix<double>,lVar6,3);
  return;
}

Assistant:

void TPZReducedSpace::InitMaterialData(TPZMaterialData &data)
{
    data.fShapeType = TPZMaterialData::EVecShape;
    auto *mat =
        dynamic_cast<TPZMatSingleSpace*>(this->Material());
    mat->FillDataRequirements(data);
    TPZConnect &c = Connect(0);
    int nshape = c.NShape();
    int nstate = c.NState();
    int dim = Reference()->Dimension();
    data.phi.Resize(nshape, nstate);
    data.dphix.Resize(dim*nstate,nshape);
    data.jacobian.Resize(dim,dim);
    data.jacinv.Resize(dim,dim);
    data.axes.Resize(dim, 3);
}